

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_statement.c
# Opt level: O3

AST * parse_finish_do_while_statement(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST_Do_While_Statement *error;
  AST *pAVar2;
  AST_Error *pAVar3;
  char *error_message;
  
  error = get_do_while_statement_tree();
  pAVar2 = parse_statement(translation_data,scope);
  error->body_statement = pAVar2;
  cVar1 = get_and_check(translation_data,KW_WHILE);
  error_message = "\'do-while\' statement is unfinished";
  if (cVar1 != '\0') {
    cVar1 = get_and_check(translation_data,KW_OPEN_NORMAL);
    if (cVar1 != '\0') {
      pAVar2 = parse_expression(translation_data,scope);
      error->condition = pAVar2;
      cVar1 = get_and_check(translation_data,KW_CLOSE_NORMAL);
      error_message = " \';\' expected";
      if (cVar1 != '\0') {
        cVar1 = get_and_check(translation_data,KW_SEMI_COLUMN);
        if (cVar1 != '\0') {
          return (AST *)error;
        }
      }
    }
  }
  push_translation_error(error_message,translation_data);
  pAVar3 = get_error_tree((AST *)error);
  return (AST *)pAVar3;
}

Assistant:

struct AST* parse_finish_do_while_statement(struct Translation_Data* translation_data,struct Scope *scope)
{
	struct AST_Do_While_Statement *hold;
	hold=get_do_while_statement_tree();
	hold->body_statement=parse_statement(translation_data,scope);
	if(get_and_check(translation_data,KW_WHILE) && get_and_check(translation_data,KW_OPEN_NORMAL))
	{
		hold->condition=parse_expression(translation_data,scope);

		if(get_and_check(translation_data,KW_CLOSE_NORMAL) && get_and_check(translation_data,KW_SEMI_COLUMN))
		{
			return (struct AST*)hold;
		}else
		{
			push_translation_error(" ';' expected",translation_data);
			return (struct AST*)get_error_tree((struct AST*)hold);
		}
	}else
	{
		push_translation_error("'do-while' statement is unfinished",translation_data);
		return (struct AST*)get_error_tree((struct AST*)hold);
	}

}